

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NearestNeighborsIndex::ByteSizeLong(NearestNeighborsIndex *this)

{
  uint uVar1;
  int32 iVar2;
  IndexTypeCase IVar3;
  DistanceFunctionCase DVar4;
  int iVar5;
  FloatVector *value;
  size_t sVar6;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  NearestNeighborsIndex *this_local;
  
  uVar1 = floatsamples_size(this);
  _i = (size_t)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = floatsamples(this,local_20);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FloatVector>(value);
    _i = sVar6 + _i;
  }
  iVar2 = numberofdimensions(this);
  if (iVar2 != 0) {
    iVar2 = numberofdimensions(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
    _i = sVar6 + 1 + _i;
  }
  IVar3 = IndexType_case(this);
  if (IVar3 != INDEXTYPE_NOT_SET) {
    if (IVar3 == kLinearIndex) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::LinearIndex>
                        ((this->IndexType_).linearindex_);
      _i = sVar6 + 2 + _i;
    }
    else if (IVar3 == kSingleKdTreeIndex) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SingleKdTreeIndex>
                        ((this->IndexType_).singlekdtreeindex_);
      _i = sVar6 + 2 + _i;
    }
  }
  DVar4 = DistanceFunction_case(this);
  if ((DVar4 != DISTANCEFUNCTION_NOT_SET) && (DVar4 == kSquaredEuclideanDistance)) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SquaredEuclideanDistance>
                      ((this->DistanceFunction_).squaredeuclideandistance_);
    _i = sVar6 + 2 + _i;
  }
  iVar5 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar5;
  return _i;
}

Assistant:

size_t NearestNeighborsIndex::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NearestNeighborsIndex)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FloatVector floatSamples = 2;
  {
    unsigned int count = this->floatsamples_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->floatsamples(i));
    }
  }

  // int32 numberOfDimensions = 1;
  if (this->numberofdimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->numberofdimensions());
  }

  switch (IndexType_case()) {
    // .CoreML.Specification.LinearIndex linearIndex = 100;
    case kLinearIndex: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *IndexType_.linearindex_);
      break;
    }
    // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
    case kSingleKdTreeIndex: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *IndexType_.singlekdtreeindex_);
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  switch (DistanceFunction_case()) {
    // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
    case kSquaredEuclideanDistance: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *DistanceFunction_.squaredeuclideandistance_);
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}